

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

double ps_config_float(ps_config_t *config,char *name)

{
  cmd_ln_val_t *pcVar1;
  cmd_ln_val_t *val;
  char *name_local;
  ps_config_t *config_local;
  
  pcVar1 = cmd_ln_access_r(config,name);
  if (pcVar1 == (cmd_ln_val_t *)0x0) {
    config_local = (ps_config_t *)0x0;
  }
  else if ((pcVar1->type & 4U) == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x24f,"Argument %s does not have floating-point type\n",name);
    config_local = (ps_config_t *)0x0;
  }
  else {
    config_local = (ps_config_t *)(pcVar1->val).ptr;
  }
  return (double)config_local;
}

Assistant:

double
ps_config_float(ps_config_t *config, char const *name)
{
    cmd_ln_val_t *val;
    val = cmd_ln_access_r(config, name);
    if (val == NULL)
        return 0.0;
    if (!(val->type & ARG_FLOATING)) {
        E_ERROR("Argument %s does not have floating-point type\n", name);
        return 0.0;
    }
    return val->val.fl;
}